

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool __thiscall
GenericTransactionSignatureChecker<CMutableTransaction>::CheckSchnorrSignature
          (GenericTransactionSignatureChecker<CMutableTransaction> *this,
          Span<const_unsigned_char> sig,Span<const_unsigned_char> pubkey_in,SigVersion sigversion,
          ScriptExecutionData *execdata,ScriptError *serror)

{
  long lVar1;
  uint8_t hash_type;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vch;
  uint256 sighash;
  XOnlyPubKey pubkey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((sigversion & ~WITNESS_V0) != TAPROOT) {
    __assert_fail("sigversion == SigVersion::TAPROOT || sigversion == SigVersion::TAPSCRIPT",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                  ,0x68b,
                  "virtual bool GenericTransactionSignatureChecker<CMutableTransaction>::CheckSchnorrSignature(Span<const unsigned char>, Span<const unsigned char>, SigVersion, ScriptExecutionData &, ScriptError *) const [T = CMutableTransaction]"
                 );
  }
  if (pubkey_in.m_size != 0x20) {
    __assert_fail("pubkey_in.size() == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                  ,0x68d,
                  "virtual bool GenericTransactionSignatureChecker<CMutableTransaction>::CheckSchnorrSignature(Span<const unsigned char>, Span<const unsigned char>, SigVersion, ScriptExecutionData &, ScriptError *) const [T = CMutableTransaction]"
                 );
  }
  if ((sig.m_size & 0xfffffffffffffffe) == 0x40) {
    vch.m_size = 0x20;
    vch.m_data = pubkey_in.m_data;
    base_blob<256U>::base_blob((base_blob<256U> *)&pubkey,vch);
    if (sig.m_size == 0x41) {
      hash_type = sig.m_data[0x40];
      if (hash_type != '\0') goto LAB_00399204;
LAB_00399274:
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_SCHNORR_SIG_HASHTYPE;
      }
    }
    else {
      hash_type = '\0';
LAB_00399204:
      sighash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      sighash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      if (this->txdata == (PrecomputedTransactionData *)0x0) {
        HandleMissingData(this->m_mdb);
      }
      else {
        bVar2 = SignatureHashSchnorr<CMutableTransaction>
                          (&sighash,execdata,this->txTo,this->nIn,hash_type,sigversion,this->txdata,
                           this->m_mdb);
        if (!bVar2) goto LAB_00399274;
        iVar3 = (*(this->super_BaseSignatureChecker)._vptr_BaseSignatureChecker[7])
                          (this,sig.m_data,0x40,&pubkey,&sighash);
        bVar2 = true;
        if ((char)iVar3 != '\0') goto LAB_0039928e;
        if (serror != (ScriptError *)0x0) {
          *serror = SCRIPT_ERR_SCHNORR_SIG;
        }
      }
    }
  }
  else if (serror != (ScriptError *)0x0) {
    *serror = SCRIPT_ERR_SCHNORR_SIG_SIZE;
  }
  bVar2 = false;
LAB_0039928e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool GenericTransactionSignatureChecker<T>::CheckSchnorrSignature(Span<const unsigned char> sig, Span<const unsigned char> pubkey_in, SigVersion sigversion, ScriptExecutionData& execdata, ScriptError* serror) const
{
    assert(sigversion == SigVersion::TAPROOT || sigversion == SigVersion::TAPSCRIPT);
    // Schnorr signatures have 32-byte public keys. The caller is responsible for enforcing this.
    assert(pubkey_in.size() == 32);
    // Note that in Tapscript evaluation, empty signatures are treated specially (invalid signature that does not
    // abort script execution). This is implemented in EvalChecksigTapscript, which won't invoke
    // CheckSchnorrSignature in that case. In other contexts, they are invalid like every other signature with
    // size different from 64 or 65.
    if (sig.size() != 64 && sig.size() != 65) return set_error(serror, SCRIPT_ERR_SCHNORR_SIG_SIZE);

    XOnlyPubKey pubkey{pubkey_in};

    uint8_t hashtype = SIGHASH_DEFAULT;
    if (sig.size() == 65) {
        hashtype = SpanPopBack(sig);
        if (hashtype == SIGHASH_DEFAULT) return set_error(serror, SCRIPT_ERR_SCHNORR_SIG_HASHTYPE);
    }
    uint256 sighash;
    if (!this->txdata) return HandleMissingData(m_mdb);
    if (!SignatureHashSchnorr(sighash, execdata, *txTo, nIn, hashtype, sigversion, *this->txdata, m_mdb)) {
        return set_error(serror, SCRIPT_ERR_SCHNORR_SIG_HASHTYPE);
    }
    if (!VerifySchnorrSignature(sig, pubkey, sighash)) return set_error(serror, SCRIPT_ERR_SCHNORR_SIG);
    return true;
}